

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_4afdb9::ConditionalExpr::printLeft(ConditionalExpr *this,OutputStream *S)

{
  StringView R;
  StringView R_00;
  StringView R_01;
  StringView R_02;
  
  R.Last = "";
  R.First = "(";
  OutputStream::operator+=(S,R);
  Node::print(this->Cond,S);
  R_00.Last = "";
  R_00.First = ") ? (";
  OutputStream::operator+=(S,R_00);
  Node::print(this->Then,S);
  R_01.Last = "";
  R_01.First = ") : (";
  OutputStream::operator+=(S,R_01);
  Node::print(this->Else,S);
  R_02.Last = "";
  R_02.First = ")";
  OutputStream::operator+=(S,R_02);
  return;
}

Assistant:

void printLeft(OutputStream &S) const override {
    S += "(";
    Cond->print(S);
    S += ") ? (";
    Then->print(S);
    S += ") : (";
    Else->print(S);
    S += ")";
  }